

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_utils.hpp
# Opt level: O2

bool Args::
     eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
               (Context *context,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *container,String *errorDescription,CmdLine *cmdLine)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  BaseException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  iterator begin;
  CmdLine *cmdLine_local;
  String local_50;
  
  pbVar1 = (context->m_context).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (context->m_it)._M_current;
  cmdLine_local = cmdLine;
  if ((pbVar2 != pbVar1) &&
     (_Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<Args::eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>(Args::Context&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,Args::CmdLine*)::_lambda(std::__cxx11::string_const&)_1_>>
                        (pbVar2,pbVar1,&cmdLine_local), _Var3._M_current != pbVar2)) {
    while( true ) {
      pbVar1 = (context->m_context).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = (context->m_it)._M_current;
      pbVar4 = pbVar2;
      __x = pbVar1;
      if (pbVar2 != pbVar1) {
        pbVar4 = pbVar2 + 1;
        (context->m_it)._M_current = pbVar4;
        __x = pbVar2;
      }
      if (__x == _Var3._M_current) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(container,__x);
    }
    if ((_Var3._M_current != pbVar1) &&
       (pbVar4 != (context->m_context).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
      (context->m_it)._M_current = pbVar4 + -1;
    }
    return true;
  }
  this = (BaseException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_50,(string *)errorDescription);
  BaseException::BaseException(this,&local_50);
  __cxa_throw(this,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

bool eatValues( Ctx & context, Container & container,
	const String & errorDescription, Cmd * cmdLine )
{
	if( !context.atEnd() )
	{
		auto begin = context.begin();

		auto last = std::find_if( context.begin(), context.end(),
			[ & ] ( const String & v ) -> bool
			{
				return( cmdLine->findArgument( v ) != nullptr );
			}
		);

		if( last != begin )
		{
			begin = context.next();

			while( begin != last )
			{
				container.push_back( *begin );

				begin = context.next();
			}

			if( last != context.end() )
				context.putBack();

			return true;
		}
	}

	throw BaseException( errorDescription );
}